

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

void __thiscall testing::internal::RE::~RE(RE *this)

{
  if (this[8] == (RE)0x1) {
    regfree((regex_t *)(this + 0x50));
    regfree((regex_t *)(this + 0x10));
  }
  free(*(void **)this);
  return;
}

Assistant:

RE::~RE() {
  if (is_valid_) {
    // regfree'ing an invalid regex might crash because the content
    // of the regex is undefined. Since the regex's are essentially
    // the same, one cannot be valid (or invalid) without the other
    // being so too.
    regfree(&partial_regex_);
    regfree(&full_regex_);
  }
  free(const_cast<char*>(pattern_));
}